

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O1

cram_block_slice_hdr * cram_decode_slice_header(cram_fd *fd,cram_block *b)

{
  byte bVar1;
  cram_content_type cVar2;
  long lVar3;
  int iVar4;
  cram_block_slice_hdr *__ptr;
  long lVar5;
  int32_t *piVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  byte *pbVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  
  cVar2 = b->content_type;
  if ((cVar2 & ~COMPRESSION_HEADER) == MAPPED_SLICE) {
    pbVar10 = b->data;
    __ptr = (cram_block_slice_hdr *)calloc(1,0x48);
    if (__ptr != (cram_block_slice_hdr *)0x0) {
      __ptr->content_type = cVar2;
      if (cVar2 == MAPPED_SLICE) {
        bVar1 = *pbVar10;
        uVar8 = (uint)bVar1;
        lVar5 = 1;
        if ((char)bVar1 < '\0') {
          uVar7 = (uint)bVar1;
          uVar8 = (uint)pbVar10[1];
          if (bVar1 < 0xc0) {
            uVar8 = (uVar7 & 0x3f) << 8 | uVar8;
            lVar9 = 2;
          }
          else if (bVar1 < 0xe0) {
            uVar8 = (uVar7 & 0x1f) << 0x10 | uVar8 << 8 | (uint)pbVar10[2];
            lVar9 = 3;
          }
          else if (bVar1 < 0xf0) {
            uVar8 = (uVar7 & 0xf) << 0x18 | uVar8 << 0x10 | (uint)pbVar10[2] << 8 | (uint)pbVar10[3]
            ;
            lVar9 = 4;
          }
          else {
            uVar8 = pbVar10[4] & 0xf |
                    (uint)pbVar10[3] << 4 | (uint)pbVar10[2] << 0xc | uVar8 << 0x14 | uVar7 << 0x1c;
            lVar9 = 5;
          }
        }
        else {
          lVar9 = 1;
        }
        __ptr->ref_seq_id = uVar8;
        bVar1 = pbVar10[lVar9];
        uVar8 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          uVar7 = (uint)bVar1;
          uVar8 = (uint)pbVar10[lVar9 + 1];
          if (bVar1 < 0xc0) {
            uVar8 = (uVar7 & 0x3f) << 8 | uVar8;
            lVar5 = 2;
          }
          else if (bVar1 < 0xe0) {
            uVar8 = (uVar7 & 0x1f) << 0x10 | uVar8 << 8 | (uint)pbVar10[lVar9 + 2];
            lVar5 = 3;
          }
          else if (bVar1 < 0xf0) {
            uVar8 = (uVar7 & 0xf) << 0x18 | uVar8 << 0x10 | (uint)pbVar10[lVar9 + 2] << 8 |
                    (uint)pbVar10[lVar9 + 3];
            lVar5 = 4;
          }
          else {
            uVar8 = pbVar10[lVar9 + 4] & 0xf |
                    (uint)pbVar10[lVar9 + 3] << 4 |
                    (uint)pbVar10[lVar9 + 2] << 0xc | uVar8 << 0x14 | uVar7 << 0x1c;
            lVar5 = 5;
          }
        }
        __ptr->ref_seq_start = uVar8;
        lVar3 = lVar5 + lVar9;
        bVar1 = pbVar10[lVar5 + lVar9];
        uVar8 = (uint)bVar1;
        lVar5 = 1;
        if ((char)bVar1 < '\0') {
          uVar7 = (uint)bVar1;
          uVar8 = (uint)pbVar10[lVar3 + 1];
          if (bVar1 < 0xc0) {
            uVar8 = (uVar7 & 0x3f) << 8 | uVar8;
            lVar5 = 2;
          }
          else if (bVar1 < 0xe0) {
            uVar8 = (uVar7 & 0x1f) << 0x10 | uVar8 << 8 | (uint)pbVar10[lVar3 + 2];
            lVar5 = 3;
          }
          else if (bVar1 < 0xf0) {
            uVar8 = (uVar7 & 0xf) << 0x18 | uVar8 << 0x10 | (uint)pbVar10[lVar3 + 2] << 8 |
                    (uint)pbVar10[lVar3 + 3];
            lVar5 = 4;
          }
          else {
            uVar8 = pbVar10[lVar3 + 4] & 0xf |
                    (uint)pbVar10[lVar3 + 3] << 4 |
                    (uint)pbVar10[lVar3 + 2] << 0xc | uVar8 << 0x14 | uVar7 << 0x1c;
            lVar5 = 5;
          }
        }
        __ptr->ref_seq_span = uVar8;
        pbVar10 = pbVar10 + lVar5 + lVar3;
      }
      bVar1 = *pbVar10;
      uVar8 = (uint)bVar1;
      lVar5 = 1;
      if ((char)bVar1 < '\0') {
        uVar7 = (uint)bVar1;
        uVar8 = (uint)pbVar10[1];
        if (bVar1 < 0xc0) {
          uVar8 = (uVar7 & 0x3f) << 8 | uVar8;
          lVar5 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar8 = (uVar7 & 0x1f) << 0x10 | uVar8 << 8 | (uint)pbVar10[2];
          lVar5 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar8 = (uVar7 & 0xf) << 0x18 | uVar8 << 0x10 | (uint)pbVar10[2] << 8 | (uint)pbVar10[3];
          lVar5 = 4;
        }
        else {
          uVar8 = pbVar10[4] & 0xf |
                  (uint)pbVar10[3] << 4 | (uint)pbVar10[2] << 0xc | uVar8 << 0x14 | uVar7 << 0x1c;
          lVar5 = 5;
        }
      }
      __ptr->num_records = uVar8;
      pbVar10 = pbVar10 + lVar5;
      __ptr->record_counter = 0;
      iVar4 = fd->version >> 8;
      if (iVar4 == 2) {
        bVar1 = *pbVar10;
        uVar8 = (uint)bVar1;
        lVar5 = 1;
        if ((char)bVar1 < '\0') {
          uVar7 = (uint)bVar1;
          uVar8 = (uint)pbVar10[1];
          if (bVar1 < 0xc0) {
            uVar8 = (uVar7 & 0x3f) << 8 | uVar8;
            lVar5 = 2;
          }
          else if (bVar1 < 0xe0) {
            uVar8 = (uVar7 & 0x1f) << 0x10 | uVar8 << 8 | (uint)pbVar10[2];
            lVar5 = 3;
          }
          else if (bVar1 < 0xf0) {
            uVar8 = (uVar7 & 0xf) << 0x18 | uVar8 << 0x10 | (uint)pbVar10[2] << 8 | (uint)pbVar10[3]
            ;
            lVar5 = 4;
          }
          else {
            uVar8 = pbVar10[4] & 0xf |
                    (uint)pbVar10[3] << 4 | (uint)pbVar10[2] << 0xc | uVar8 << 0x14 | uVar7 << 0x1c;
            lVar5 = 5;
          }
        }
        pbVar10 = pbVar10 + lVar5;
        __ptr->record_counter = (long)(int)uVar8;
      }
      else if (2 < iVar4) {
        iVar4 = ltf8_get((char *)pbVar10,&__ptr->record_counter);
        pbVar10 = pbVar10 + iVar4;
      }
      bVar1 = *pbVar10;
      uVar8 = (uint)bVar1;
      lVar5 = 1;
      if ((char)bVar1 < '\0') {
        uVar7 = (uint)bVar1;
        uVar8 = (uint)pbVar10[1];
        if (bVar1 < 0xc0) {
          uVar8 = (uVar7 & 0x3f) << 8 | uVar8;
          lVar9 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar8 = (uVar7 & 0x1f) << 0x10 | uVar8 << 8 | (uint)pbVar10[2];
          lVar9 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar8 = (uVar7 & 0xf) << 0x18 | uVar8 << 0x10 | (uint)pbVar10[2] << 8 | (uint)pbVar10[3];
          lVar9 = 4;
        }
        else {
          uVar8 = pbVar10[4] & 0xf |
                  (uint)pbVar10[3] << 4 | (uint)pbVar10[2] << 0xc | uVar8 << 0x14 | uVar7 << 0x1c;
          lVar9 = 5;
        }
      }
      else {
        lVar9 = 1;
      }
      __ptr->num_blocks = uVar8;
      bVar1 = pbVar10[lVar9];
      uVar8 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        uVar7 = (uint)bVar1;
        uVar8 = (uint)pbVar10[lVar9 + 1];
        if (bVar1 < 0xc0) {
          uVar8 = (uVar7 & 0x3f) << 8 | uVar8;
          lVar5 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar8 = (uVar7 & 0x1f) << 0x10 | uVar8 << 8 | (uint)pbVar10[lVar9 + 2];
          lVar5 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar8 = (uVar7 & 0xf) << 0x18 | uVar8 << 0x10 | (uint)pbVar10[lVar9 + 2] << 8 |
                  (uint)pbVar10[lVar9 + 3];
          lVar5 = 4;
        }
        else {
          uVar8 = pbVar10[lVar9 + 4] & 0xf |
                  (uint)pbVar10[lVar9 + 3] << 4 |
                  (uint)pbVar10[lVar9 + 2] << 0xc | uVar8 << 0x14 | uVar7 << 0x1c;
          lVar5 = 5;
        }
      }
      __ptr->num_content_ids = uVar8;
      piVar6 = (int32_t *)malloc((long)(int)uVar8 << 2);
      __ptr->block_content_ids = piVar6;
      if (piVar6 != (int32_t *)0x0) {
        pbVar10 = pbVar10 + lVar5 + lVar9;
        iVar4 = __ptr->num_content_ids;
        if (0 < (long)iVar4) {
          lVar5 = 0;
          do {
            bVar1 = *pbVar10;
            uVar8 = (uint)bVar1;
            lVar9 = 1;
            if ((char)bVar1 < '\0') {
              uVar7 = (uint)bVar1;
              uVar8 = (uint)pbVar10[1];
              if (bVar1 < 0xc0) {
                uVar8 = (uVar7 & 0x3f) << 8 | uVar8;
                lVar9 = 2;
              }
              else if (bVar1 < 0xe0) {
                uVar8 = (uVar7 & 0x1f) << 0x10 | uVar8 << 8 | (uint)pbVar10[2];
                lVar9 = 3;
              }
              else if (bVar1 < 0xf0) {
                uVar8 = (uVar7 & 0xf) << 0x18 | uVar8 << 0x10 | (uint)pbVar10[2] << 8 |
                        (uint)pbVar10[3];
                lVar9 = 4;
              }
              else {
                uVar8 = pbVar10[4] & 0xf |
                        (uint)pbVar10[3] << 4 |
                        (uint)pbVar10[2] << 0xc | uVar8 << 0x14 | uVar7 << 0x1c;
                lVar9 = 5;
              }
            }
            piVar6[lVar5] = uVar8;
            pbVar10 = pbVar10 + lVar9;
            lVar5 = lVar5 + 1;
          } while (iVar4 != lVar5);
        }
        if (b->content_type == MAPPED_SLICE) {
          bVar1 = *pbVar10;
          uVar8 = (uint)bVar1;
          lVar5 = 1;
          if ((char)bVar1 < '\0') {
            uVar7 = (uint)bVar1;
            uVar8 = (uint)pbVar10[1];
            if (bVar1 < 0xc0) {
              uVar8 = (uVar7 & 0x3f) << 8 | uVar8;
              lVar5 = 2;
            }
            else if (bVar1 < 0xe0) {
              uVar8 = (uVar7 & 0x1f) << 0x10 | uVar8 << 8 | (uint)pbVar10[2];
              lVar5 = 3;
            }
            else if (bVar1 < 0xf0) {
              uVar8 = (uVar7 & 0xf) << 0x18 | uVar8 << 0x10 | (uint)pbVar10[2] << 8 |
                      (uint)pbVar10[3];
              lVar5 = 4;
            }
            else {
              uVar8 = pbVar10[4] & 0xf |
                      (uint)pbVar10[3] << 4 |
                      (uint)pbVar10[2] << 0xc | uVar8 << 0x14 | uVar7 << 0x1c;
              lVar5 = 5;
            }
          }
          __ptr->ref_base_id = uVar8;
          pbVar10 = pbVar10 + lVar5;
        }
        if ((fd->version & 0xffffff00U) == 0x100) {
          uVar11 = 0;
          uVar12 = 0;
          uVar13 = 0;
          uVar14 = 0;
        }
        else {
          uVar11 = *(undefined4 *)pbVar10;
          uVar12 = *(undefined4 *)(pbVar10 + 4);
          uVar13 = *(undefined4 *)(pbVar10 + 8);
          uVar14 = *(undefined4 *)(pbVar10 + 0xc);
        }
        *(undefined4 *)__ptr->md5 = uVar11;
        *(undefined4 *)(__ptr->md5 + 4) = uVar12;
        *(undefined4 *)(__ptr->md5 + 8) = uVar13;
        *(undefined4 *)(__ptr->md5 + 0xc) = uVar14;
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (cram_block_slice_hdr *)0x0;
}

Assistant:

cram_block_slice_hdr *cram_decode_slice_header(cram_fd *fd, cram_block *b) {
    cram_block_slice_hdr *hdr;
    char *cp = (char *)b->data;
    int i;

    if (b->content_type != MAPPED_SLICE &&
	b->content_type != UNMAPPED_SLICE)
	return NULL;

    if (!(hdr  = calloc(1, sizeof(*hdr))))
	return NULL;

    hdr->content_type = b->content_type;

    if (b->content_type == MAPPED_SLICE) {
	cp += itf8_get(cp, &hdr->ref_seq_id);
	cp += itf8_get(cp, &hdr->ref_seq_start);
	cp += itf8_get(cp, &hdr->ref_seq_span);
    }
    cp += itf8_get(cp, &hdr->num_records);
    hdr->record_counter = 0;
    if (CRAM_MAJOR_VERS(fd->version) == 2) {
	int32_t i32;
	cp += itf8_get(cp, &i32);
	hdr->record_counter = i32;
    } else if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	cp += ltf8_get(cp, &hdr->record_counter);
    }

    cp += itf8_get(cp, &hdr->num_blocks);

    cp += itf8_get(cp, &hdr->num_content_ids);
    hdr->block_content_ids = malloc(hdr->num_content_ids * sizeof(int32_t));
    if (!hdr->block_content_ids) {
	free(hdr);
	return NULL;
    }

    for (i = 0; i < hdr->num_content_ids; i++) {
	cp += itf8_get(cp, &hdr->block_content_ids[i]);
    }

    if (b->content_type == MAPPED_SLICE) {
	cp += itf8_get(cp, &hdr->ref_base_id);
    }

    if (CRAM_MAJOR_VERS(fd->version) != 1) {
	memcpy(hdr->md5, cp, 16);
    } else {
	memset(hdr->md5, 0, 16);
    }

    return hdr;
}